

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksplitter.c
# Opt level: O0

size_t FindMinimum(FindMinimumFun *f,void *context,size_t start,size_t end,double *smallest)

{
  size_t in_RCX;
  size_t in_RDX;
  undefined8 in_RSI;
  code *in_RDI;
  double *in_R8;
  double dVar1;
  size_t pos;
  double lastbest;
  double best_1;
  size_t besti;
  double vp [9];
  size_t p [9];
  size_t i_1;
  double v;
  size_t i;
  size_t result;
  double best;
  size_t local_130;
  size_t local_128;
  size_t local_118;
  double local_110;
  double local_108;
  ulong local_100;
  double local_f8 [10];
  size_t asStack_a8 [10];
  ulong local_58;
  double local_50;
  ulong local_48;
  size_t local_40;
  double local_38;
  double *local_30;
  ulong local_28;
  size_t local_20;
  undefined8 local_18;
  code *local_10;
  size_t local_8;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RCX - in_RDX < 0x400) {
    local_38 = 1e+30;
    local_40 = in_RDX;
    for (local_48 = in_RDX; local_48 < local_28; local_48 = local_48 + 1) {
      local_50 = (double)(*local_10)(local_48,local_18);
      if (local_50 < local_38) {
        local_40 = local_48;
        local_38 = local_50;
      }
    }
    *local_30 = local_38;
    local_8 = local_40;
  }
  else {
    local_110 = 1e+30;
    local_118 = in_RDX;
    local_20 = in_RDX;
    while (9 < local_28 - local_20) {
      for (local_58 = 0; local_58 < 9; local_58 = local_58 + 1) {
        asStack_a8[local_58] = local_20 + (local_58 + 1) * ((local_28 - local_20) / 10);
        dVar1 = (double)(*local_10)(asStack_a8[local_58],local_18);
        local_f8[local_58] = dVar1;
      }
      local_100 = 0;
      local_108 = local_f8[0];
      for (local_58 = 1; local_58 < 9; local_58 = local_58 + 1) {
        if (local_f8[local_58] < local_108) {
          local_108 = local_f8[local_58];
          local_100 = local_58;
        }
      }
      if (local_110 < local_108) break;
      if (local_100 == 0) {
        local_128 = local_20;
      }
      else {
        local_128 = asStack_a8[local_100 - 1];
      }
      local_20 = local_128;
      if (local_100 == 8) {
        local_130 = local_28;
      }
      else {
        local_130 = asStack_a8[local_100 + 1];
      }
      local_28 = local_130;
      local_118 = asStack_a8[local_100];
      local_110 = local_108;
    }
    *local_30 = local_110;
    local_8 = local_118;
  }
  return local_8;
}

Assistant:

static size_t FindMinimum(FindMinimumFun f, void* context,
                          size_t start, size_t end, double* smallest) {
  if (end - start < 1024) {
    double best = ZOPFLI_LARGE_FLOAT;
    size_t result = start;
    size_t i;
    for (i = start; i < end; i++) {
      double v = f(i, context);
      if (v < best) {
        best = v;
        result = i;
      }
    }
    *smallest = best;
    return result;
  } else {
    /* Try to find minimum faster by recursively checking multiple points. */
#define NUM 9  /* Good value: 9. */
    size_t i;
    size_t p[NUM];
    double vp[NUM];
    size_t besti;
    double best;
    double lastbest = ZOPFLI_LARGE_FLOAT;
    size_t pos = start;

    for (;;) {
      if (end - start <= NUM) break;

      for (i = 0; i < NUM; i++) {
        p[i] = start + (i + 1) * ((end - start) / (NUM + 1));
        vp[i] = f(p[i], context);
      }
      besti = 0;
      best = vp[0];
      for (i = 1; i < NUM; i++) {
        if (vp[i] < best) {
          best = vp[i];
          besti = i;
        }
      }
      if (best > lastbest) break;

      start = besti == 0 ? start : p[besti - 1];
      end = besti == NUM - 1 ? end : p[besti + 1];

      pos = p[besti];
      lastbest = best;
    }
    *smallest = lastbest;
    return pos;
#undef NUM
  }
}